

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

UBool __thiscall icu_63::OlsonTimeZone::useDaylightTime(OlsonTimeZone *this)

{
  int16_t iVar1;
  int iVar2;
  int32_t iVar3;
  int64_t iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double transition;
  int16_t i;
  double limit;
  double start;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  UDate current;
  OlsonTimeZone *this_local;
  
  current = (UDate)this;
  _month = uprv_getUTCtime_63();
  if ((this->finalZone == (SimpleTimeZone *)0x0) || (_month < this->finalStartMillis)) {
    Grego::timeToFields(_month,&dom,&dow,&doy,&mid,(int32_t *)((long)&start + 4),(int32_t *)&start);
    dVar5 = Grego::fieldsToDay(dom,0,1);
    dVar6 = Grego::fieldsToDay(dom + 1,0,1);
    for (transition._6_2_ = 0; iVar1 = transitionCount(this), transition._6_2_ < iVar1;
        transition._6_2_ = transition._6_2_ + 1) {
      iVar4 = transitionTimeInSeconds(this,transition._6_2_);
      dVar7 = (double)iVar4;
      if (dVar6 * 86400.0 <= dVar7) break;
      if (((dVar5 * 86400.0 <= dVar7) && (iVar3 = dstOffsetAt(this,transition._6_2_), iVar3 != 0))
         || ((dVar5 * 86400.0 < dVar7 &&
             (iVar3 = dstOffsetAt(this,transition._6_2_ + -1), iVar3 != 0)))) {
        return '\x01';
      }
    }
    this_local._7_1_ = '\0';
  }
  else {
    iVar2 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                      ();
    this_local._7_1_ = (UBool)iVar2;
  }
  return this_local._7_1_;
}

Assistant:

UBool OlsonTimeZone::useDaylightTime() const {
    // If DST was observed in 1942 (for example) but has never been
    // observed from 1943 to the present, most clients will expect
    // this method to return FALSE.  This method determines whether
    // DST is in use in the current year (at any point in the year)
    // and returns TRUE if so.

    UDate current = uprv_getUTCtime();
    if (finalZone != NULL && current >= finalStartMillis) {
        return finalZone->useDaylightTime();
    }

    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(current, year, month, dom, dow, doy, mid);

    // Find start of this year, and start of next year
    double start = Grego::fieldsToDay(year, 0, 1) * SECONDS_PER_DAY;
    double limit = Grego::fieldsToDay(year+1, 0, 1) * SECONDS_PER_DAY;

    // Return TRUE if DST is observed at any time during the current
    // year.
    for (int16_t i = 0; i < transitionCount(); ++i) {
        double transition = (double)transitionTimeInSeconds(i);
        if (transition >= limit) {
            break;
        }
        if ((transition >= start && dstOffsetAt(i) != 0)
                || (transition > start && dstOffsetAt(i - 1) != 0)) {
            return TRUE;
        }
    }
    return FALSE;
}